

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O0

void __thiscall
ktxValidator::validateDxgiFormat
          (ktxValidator *this,validationContext *param_2,char *key,uint8_t *param_4,
          uint32_t valueLen)

{
  issue *in_RCX;
  undefined8 in_RDX;
  severity severity;
  ktxValidator *in_RSI;
  int in_R8D;
  issue *in_stack_ffffffffffffff88;
  issue local_50;
  undefined4 in_stack_ffffffffffffffd8;
  
  severity = (severity)((ulong)in_RDX >> 0x20);
  if (in_R8D != 4) {
    ::issue::issue(&local_50,in_stack_ffffffffffffff88);
    addIssue<char_const*>(in_RSI,severity,in_RCX,(char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8))
    ;
    ::issue::~issue((issue *)0x10cfcc);
  }
  return;
}

Assistant:

void
ktxValidator::validateDxgiFormat(validationContext& /*ctx*/,
                                 const char* key,
                                 const uint8_t* /*value*/,
                                 uint32_t valueLen)
                            {
    if (valueLen != sizeof(uint32_t))
        addIssue(logger::eError, Metadata.InvalidValue, key);}